

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  
  debug_test();
  iVar1 = emit_test();
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    int ret = 0;

    (void)argc;
    (void)argv;

    ret |= debug_test();
    ret |= emit_test();
    return ret;
}